

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testModule.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  code *local_1028;
  hello_world_t hello_world;
  xmlModulePtr module;
  xmlChar filename [4096];
  char **argv_local;
  int argc_local;
  
  hello_world = (hello_world_t)0x0;
  local_1028 = (code *)0x0;
  filename._4088_8_ = argv;
  xmlStrPrintf(&module,0x1000,"%s/testdso%s",".libs",".so");
  hello_world = (hello_world_t)xmlModuleOpen(&module,0);
  if (hello_world == (hello_world_t)0x0) {
    fprintf(_stderr,"Failed to open module\n");
    argv_local._4_4_ = 1;
  }
  else {
    iVar1 = xmlModuleSymbol(hello_world,"hello_world",&local_1028);
    if (iVar1 == 0) {
      if (local_1028 == (code *)0x0) {
        fprintf(_stderr,"Lookup returned NULL\n");
        argv_local._4_4_ = 1;
      }
      else {
        (*local_1028)();
        xmlModuleClose(hello_world);
        argv_local._4_4_ = 0;
      }
    }
    else {
      fprintf(_stderr,"Failure to lookup\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    xmlChar filename[PATH_MAX];
    xmlModulePtr module = NULL;
    hello_world_t hello_world = NULL;

    /* build the module filename, and confirm the module exists */
    xmlStrPrintf(filename, sizeof(filename),
                 "%s/testdso%s",
                 (const xmlChar*)MODULE_PATH,
                 (const xmlChar*)LIBXML_MODULE_EXTENSION);

    module = xmlModuleOpen((const char*)filename, 0);
    if (module == NULL) {
      fprintf(stderr, "Failed to open module\n");
      return(1);
    }

    if (xmlModuleSymbol(module, "hello_world", (void **) &hello_world)) {
      fprintf(stderr, "Failure to lookup\n");
      return(1);
    }
    if (hello_world == NULL) {
      fprintf(stderr, "Lookup returned NULL\n");
      return(1);
    }

    (*hello_world)();

    xmlModuleClose(module);

    return(0);
}